

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O2

void __thiscall
rsg::EqualityComparisonOp<false>::EqualityComparisonOp
          (EqualityComparisonOp<false> *this,GeneratorState *state,
          ConstValueRangeAccess inValueRange)

{
  VariableType *this_00;
  ValueRange *this_01;
  ValueRange *this_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  pointer pSVar4;
  pointer pSVar5;
  Random *rnd;
  deRandom *rnd_00;
  ValueRangeAccess valueRange_00;
  Type TVar6;
  uint uVar7;
  deUint32 dVar8;
  pointer pSVar9;
  float *bMax;
  pointer pSVar10;
  float *aMin;
  pointer pSVar11;
  float *bMin;
  long lVar12;
  pointer pSVar13;
  float *aMax;
  float fVar14;
  Type inBaseTypes [2];
  ValueRange *local_198;
  Scalar *pSStack_190;
  Scalar *local_188;
  VariableType local_180;
  ValueRange local_130;
  ValueRange valueRange;
  
  BinaryOp<8,_(rsg::Associativity)0>::BinaryOp
            (&this->super_BinaryOp<8,_(rsg::Associativity)0>,CMP_NE);
  (this->super_BinaryOp<8,_(rsg::Associativity)0>).super_Expression._vptr_Expression =
       (_func_int **)&PTR__BinaryOp_00192b58;
  ValueRange::ValueRange(&valueRange,inValueRange);
  paVar1 = &local_180.m_typeName.field_2;
  if (valueRange.m_type.m_baseType == TYPE_VOID) {
    local_180.m_baseType = TYPE_BOOL;
    local_180.m_precision = PRECISION_NONE;
    local_180.m_typeName._M_string_length = 0;
    local_180.m_typeName.field_2._M_local_buf[0] = '\0';
    local_180.m_numElements = 1;
    local_180.m_elementType = (VariableType *)0x0;
    local_180.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_180.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_180.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_180.m_typeName._M_dataplus._M_p = (pointer)paVar1;
    ValueRange::ValueRange(&local_130,&local_180);
    ValueRange::operator=(&valueRange,&local_130);
    ValueRange::~ValueRange(&local_130);
    VariableType::~VariableType(&local_180);
    pSStack_190 = valueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (valueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        valueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSStack_190 = (Scalar *)0x0;
    }
    local_188 = valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_start;
    if (valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_188 = (Scalar *)0x0;
    }
    valueRange_00.super_ConstValueRangeAccess.m_min = pSStack_190;
    valueRange_00.super_ConstValueRangeAccess.m_type = &valueRange.m_type;
    valueRange_00.super_ConstValueRangeAccess.m_max = local_188;
    local_198 = &valueRange;
    computeRandomValueRange(state,valueRange_00);
  }
  this_00 = &(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_type;
  VariableType::operator=(this_00,&valueRange.m_type);
  ValueStorage<64>::setStorage(&(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_value,this_00);
  inBaseTypes[0] = TYPE_FLOAT;
  inBaseTypes[1] = TYPE_INT;
  TVar6 = de::Random::choose<rsg::VariableType::Type,rsg::VariableType::Type*>
                    (state->m_random,inBaseTypes,(Type *)&local_198);
  uVar7 = de::Random::getInt(state->m_random,1,
                             (uint)(2 < state->m_shaderParams->maxExpressionDepth -
                                        state->m_expressionDepth) * 3 + 1);
  local_180.m_precision = PRECISION_NONE;
  local_180.m_baseType = TVar6;
  local_180.m_typeName._M_string_length = 0;
  local_180.m_typeName.field_2._M_local_buf[0] = '\0';
  local_180.m_elementType = (VariableType *)0x0;
  local_180.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_180.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_180.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180.m_typeName._M_dataplus._M_p = (pointer)paVar1;
  local_180.m_numElements = uVar7;
  ValueRange::ValueRange(&local_130,&local_180);
  this_02 = &(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_rightValueRange;
  ValueRange::operator=(this_02,&local_130);
  ValueRange::~ValueRange(&local_130);
  VariableType::~VariableType(&local_180);
  local_180.m_precision = PRECISION_NONE;
  local_180.m_typeName._M_string_length = 0;
  local_180.m_typeName.field_2._M_local_buf[0] = '\0';
  local_180.m_elementType = (VariableType *)0x0;
  local_180.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_180.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_180.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180.m_typeName._M_dataplus._M_p = (pointer)paVar1;
  local_180.m_numElements = uVar7;
  ValueRange::ValueRange(&local_130,&local_180);
  this_01 = &(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_leftValueRange;
  ValueRange::operator=(this_01,&local_130);
  ValueRange::~ValueRange(&local_130);
  VariableType::~VariableType(&local_180);
  if ((int)uVar7 < 1) {
    uVar7 = 0;
  }
  for (lVar12 = 0; (ulong)uVar7 << 2 != lVar12; lVar12 = lVar12 + 4) {
    bVar2 = (valueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start)->boolVal;
    bVar3 = (valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start)->boolVal;
    pSVar10 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_leftValueRange.m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar11 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_leftValueRange.m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pSVar13 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_leftValueRange.m_max.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar4 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_leftValueRange.m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish;
    VariableType::getElementType(&this_01->m_type);
    if (pSVar13 == pSVar4) {
      pSVar13 = (pointer)0x0;
    }
    if (pSVar10 == pSVar11) {
      pSVar10 = (pointer)0x0;
    }
    pSVar11 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_rightValueRange.m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar4 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_rightValueRange.m_min.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar9 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_rightValueRange.m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar5 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_rightValueRange.m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish;
    VariableType::getElementType(&this_02->m_type);
    aMin = (float *)((long)pSVar10 + lVar12);
    aMax = (float *)((long)pSVar13 + lVar12);
    if (pSVar9 == pSVar5) {
      pSVar9 = (pointer)0x0;
    }
    if (pSVar11 == pSVar4) {
      pSVar11 = (pointer)0x0;
    }
    bMin = (float *)((long)pSVar11 + lVar12);
    bMax = (float *)((long)pSVar9 + lVar12);
    if (TVar6 == TYPE_INT) {
      rnd_00 = &state->m_random->m_rnd;
      if (bVar3 == true && bVar2 == false) {
        ComputeLessThanRange::operator()
                  ((ComputeLessThanRange *)&local_130,(Random *)rnd_00,false,true,(int *)aMin,
                   (int *)aMax,(int *)bMin,(int *)bMax);
      }
      else if (bVar2 == false) {
        dVar8 = deRandom_getUint32(rnd_00);
        fVar14 = (float)(dVar8 % 3 - 1);
        *aMin = fVar14;
        *aMax = fVar14;
        *bMin = fVar14;
        *bMax = fVar14;
      }
      else {
        ComputeLessThanRange::operator()
                  ((ComputeLessThanRange *)&local_130,(Random *)rnd_00,true,true,(int *)aMin,
                   (int *)aMax,(int *)bMin,(int *)bMax);
      }
    }
    else if (TVar6 == TYPE_FLOAT) {
      rnd = state->m_random;
      if (bVar3 == true && bVar2 == false) {
        ComputeLessThanRange::operator()
                  ((ComputeLessThanRange *)&local_130,rnd,false,true,aMin,aMax,bMin,bMax);
      }
      else if (bVar2 == false) {
        fVar14 = getQuantizedFloat(rnd,-1.0,1.0,0.5);
        *aMin = fVar14;
        *aMax = fVar14;
        *bMin = fVar14;
        *bMax = fVar14;
      }
      else {
        ComputeLessThanRange::operator()
                  ((ComputeLessThanRange *)&local_130,rnd,true,true,aMin,aMax,bMin,bMax);
      }
    }
    else if (bVar2 == false && (bool)(bVar3 ^ 1U) == false) {
      *(undefined1 *)aMin = 0;
      *(undefined1 *)aMax = 1;
      *(undefined1 *)bMin = 0;
      *(undefined1 *)bMax = 1;
    }
    else {
      (anonymous_namespace)::computeEqualityValueRange<true,bool>
                (state->m_random,(bool)(bVar2 ^ 1),(bool)(bVar3 ^ 1U),(bool *)aMin,(bool *)aMax,
                 (bool *)bMin,(bool *)bMax);
    }
  }
  ValueRange::~ValueRange(&valueRange);
  return;
}

Assistant:

EqualityComparisonOp<IsEqual>::EqualityComparisonOp (GeneratorState& state, ConstValueRangeAccess inValueRange)
	: BinaryOp<8, ASSOCIATIVITY_LEFT>(IsEqual ? Token::CMP_EQ : Token::CMP_NE)
{
	ValueRange valueRange = inValueRange;

	if (valueRange.getType().isVoid())
	{
		valueRange = ValueRange(VariableType(VariableType::TYPE_BOOL, 1));
		computeRandomValueRange(state, valueRange.asAccess());
	}

	// Choose type, allocate storage for execution
	this->m_type = valueRange.getType();
	this->m_value.setStorage(this->m_type);

	// Choose random input type
	VariableType::Type inBaseTypes[]	= { VariableType::TYPE_FLOAT, VariableType::TYPE_INT };
	VariableType::Type inBaseType		= state.getRandom().choose<VariableType::Type>(&inBaseTypes[0], &inBaseTypes[DE_LENGTH_OF_ARRAY(inBaseTypes)]);
	int					availableLevels	= state.getShaderParameters().maxExpressionDepth - state.getExpressionDepth();
	int					numElements		= state.getRandom().getInt(1, availableLevels >= 3 ? 4 : 1);

	// Initialize storage for input value ranges
	this->m_rightValueRange	= ValueRange(VariableType(inBaseType, numElements));
	this->m_leftValueRange	= ValueRange(VariableType(inBaseType, numElements));

	// Compute range for b that satisfies requested value range
	for (int elementNdx = 0; elementNdx < numElements; elementNdx++)
	{
		bool					dstMin	= valueRange.getMin().asBool();
		bool					dstMax	= valueRange.getMax().asBool();

		ValueRangeAccess		a		= this->m_leftValueRange.asAccess().component(elementNdx);
		ValueRangeAccess		b		= this->m_rightValueRange.asAccess().component(elementNdx);

		if (inBaseType == VariableType::TYPE_FLOAT)
			computeEqualityValueRange<IsEqual>(state.getRandom(), dstMin, dstMax,
											   a.getMin().asFloat(), a.getMax().asFloat(),
											   b.getMin().asFloat(), b.getMax().asFloat());
		else if (inBaseType == VariableType::TYPE_INT)
			computeEqualityValueRange<IsEqual>(state.getRandom(), dstMin, dstMax,
											   a.getMin().asInt(), a.getMax().asInt(),
											   b.getMin().asInt(), b.getMax().asInt());
		else
		{
			DE_ASSERT(inBaseType == VariableType::TYPE_BOOL);
			computeEqualityValueRange<IsEqual>(state.getRandom(), dstMin, dstMax,
											   a.getMin().asBool(), a.getMax().asBool(),
											   b.getMin().asBool(), b.getMax().asBool());
		}
	}
}